

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::batch_normalize_conv_inference
               (double eps,resizable_tensor *dest,tensor *src,tensor *gamma,tensor *beta,
               tensor *running_means,tensor *running_variances)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar5;
  fatal_error *this;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t new_size;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  ostringstream dlib_o_out;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  if (((gamma->m_n == 1) && (gamma->m_nr == 1)) && (gamma->m_nc == 1)) {
    lVar10 = gamma->m_k;
    lVar12 = src->m_k;
    if (((((lVar10 == lVar12) && (beta->m_n == 1)) &&
         ((lVar10 == beta->m_k && ((beta->m_nr == 1 && (beta->m_nc == 1)))))) &&
        (running_means->m_n == 1)) &&
       (((lVar10 == running_means->m_k && (running_means->m_nr == 1)) && (running_means->m_nc == 1))
       )) {
      bVar13 = false;
      if (((running_variances->m_n == 1) && (bVar13 = false, lVar10 == running_variances->m_k)) &&
         (running_variances->m_nr == 1)) {
        bVar13 = running_variances->m_nc == 1;
      }
      if ((0.0 < eps) && (bVar13)) {
        lVar10 = src->m_n;
        lVar7 = src->m_nr;
        lVar8 = src->m_nc;
        (dest->super_tensor).m_n = lVar10;
        (dest->super_tensor).m_k = lVar12;
        (dest->super_tensor).m_nr = lVar7;
        (dest->super_tensor).m_nc = lVar8;
        new_size = lVar7 * lVar8 * lVar10 * lVar12;
        (dest->super_tensor).m_size = new_size;
        gpu_data::set_size(&dest->data_instance,new_size);
        iVar1 = (*(dest->super_tensor)._vptr_tensor[3])(dest);
        lVar10 = CONCAT44(extraout_var,iVar1);
        iVar1 = (*src->_vptr_tensor[2])(src);
        lVar12 = CONCAT44(extraout_var_00,iVar1);
        iVar1 = (*gamma->_vptr_tensor[2])(gamma);
        iVar2 = (*beta->_vptr_tensor[2])(beta);
        iVar3 = (*running_means->_vptr_tensor[2])(running_means);
        iVar4 = (*running_variances->_vptr_tensor[2])();
        if (0 < src->m_n) {
          lVar8 = src->m_nc * src->m_nr;
          lVar7 = 0;
          do {
            if (0 < src->m_k) {
              lVar9 = 0;
              do {
                dVar14 = (double)*(float *)(CONCAT44(extraout_var_04,iVar4) + lVar9 * 4) + eps;
                if (dVar14 < 0.0) {
                  dVar14 = sqrt(dVar14);
                }
                else {
                  dVar14 = SQRT(dVar14);
                }
                if (0 < lVar8) {
                  lVar11 = 0;
                  lVar6 = 0;
                  do {
                    *(float *)(lVar10 + lVar6 * 4) =
                         (*(float *)(lVar12 + lVar6 * 4) -
                         *(float *)(CONCAT44(extraout_var_03,iVar3) + lVar9 * 4)) *
                         *(float *)(CONCAT44(extraout_var_01,iVar1) + lVar9 * 4) *
                         (float)(1.0 / dVar14) +
                         *(float *)(CONCAT44(extraout_var_02,iVar2) + lVar9 * 4);
                    lVar6 = lVar6 + 1;
                    lVar11 = lVar11 + -4;
                  } while (lVar8 - lVar6 != 0);
                  lVar10 = lVar10 - lVar11;
                  lVar12 = lVar12 - lVar11;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < src->m_k);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < src->m_n);
        }
        return;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
  poVar5 = (ostream *)std::ostream::operator<<(local_1a8,0x3b3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void dlib::cpu::batch_normalize_conv_inference(const double, resizable_tensor &, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &)"
             ,0xa0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "gamma.num_samples() == 1 && gamma.nr() == 1 && gamma.nc() == 1 && gamma.k() == src.k() && have_same_dimensions(gamma, beta) && have_same_dimensions(gamma, running_means) && have_same_dimensions(gamma, running_variances) && eps > 0"
             ,0xe6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\ngamma.num_samples(): ",0x16);
  poVar5 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\ngamma.k():  ",0xd);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\ngamma.nr(): ",0xd);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\ngamma.nc(): ",0xd);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nbeta.num_samples(): ",0x15);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nbeta.k():   ",0xd);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nbeta.nr():  ",0xd);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nbeta.nc():  ",0xd);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrunning_means.num_samples(): ",0x1e);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrunning_means.k():   ",0x16);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrunning_means.nr():  ",0x16);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrunning_means.nc():  ",0x16);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"\nrunning_variances.num_samples(): ",0x22);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrunning_variances.k():   ",0x1a);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrunning_variances.nr():  ",0x1a);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrunning_variances.nc():  ",0x1a);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nsrc.k():   ",0xc);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nsrc.nr():  ",0xc);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nsrc.nc():  ",0xc);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\neps:  ",7);
  poVar5 = std::ostream::_M_insert<double>(eps);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void batch_normalize_conv_inference (
            const double eps,
            resizable_tensor& dest,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta,
            const tensor& running_means,
            const tensor& running_variances
        )
        {
            DLIB_CASSERT(
                gamma.num_samples() == 1 && 
                gamma.nr() == 1 &&
                gamma.nc() == 1 &&
                gamma.k()  == src.k() &&
                have_same_dimensions(gamma, beta) &&
                have_same_dimensions(gamma, running_means) &&
                have_same_dimensions(gamma, running_variances) &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nrunning_means.num_samples(): " << running_means.num_samples() << 
                "\nrunning_means.k():   " << running_means.k() << 
                "\nrunning_means.nr():  " << running_means.nr() << 
                "\nrunning_means.nc():  " << running_means.nc() << 
                "\nrunning_variances.num_samples(): " << running_variances.num_samples() << 
                "\nrunning_variances.k():   " << running_variances.k() << 
                "\nrunning_variances.nr():  " << running_variances.nr() << 
                "\nrunning_variances.nc():  " << running_variances.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );
            dest.copy_size(src);

            auto d = dest.host();
            auto s = src.host();
            auto g = gamma.host();
            auto b = beta.host();
            auto m = running_means.host();
            auto v = running_variances.host();

            const long num = src.nr()*src.nc();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    const float invstd = 1.0f/std::sqrt(v[k] + eps);
                    for (long j = 0; j < num; ++j)
                    {
                        *d = g[k]*(*s - m[k])*invstd + b[k];
                        ++d;
                        ++s;
                    }
                }
            }
        }